

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLGrammarPoolImpl.cpp
# Opt level: O3

XSModel * __thiscall
xercesc_4_0::XMLGrammarPoolImpl::getXSModel(XMLGrammarPoolImpl *this,bool *XSModelWasChanged)

{
  *XSModelWasChanged = false;
  if ((this->fLocked == false) && (this->fXSModelIsValid == false)) {
    (*(this->super_XMLGrammarPool)._vptr_XMLGrammarPool[0x11])(this);
    *XSModelWasChanged = true;
  }
  return this->fXSModel;
}

Assistant:

XSModel *XMLGrammarPoolImpl::getXSModel(bool& XSModelWasChanged)
{
    XSModelWasChanged = false;
    if (fLocked || fXSModelIsValid)
        return fXSModel;

    createXSModel();
    XSModelWasChanged = true;
    return fXSModel;
}